

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O2

void export_token_to_json
               (DString *out,simple_token *t,char *source,int lev,stack *s,_Bool array_out)

{
  char cVar1;
  simple_token *psVar2;
  DString *out_00;
  size_t index;
  char *pcVar3;
  simple_token **ppsVar4;
  size_t sStack_60;
  
  if (t == (simple_token *)0x0) {
    return;
  }
  switch(t->type) {
  case 0:
    sStack_60 = 2;
    d_string_append_c_array(out,"[\n",2);
    export_token_tree_to_json(out,t->child,source,lev + 1,s,array_out);
    pcVar3 = "]\n";
    goto LAB_00108d78;
  case 1:
  case 5:
  case 7:
    pcVar3 = source + t->start;
    sStack_60 = t->len;
    goto LAB_00108d78;
  case 2:
    cVar1 = source[t->start];
    switch(cVar1) {
    case '\b':
      pcVar3 = "\\b";
      break;
    case '\t':
      pcVar3 = "\\t";
      break;
    case '\n':
      goto switchD_00108b6e_caseD_a;
    case '\v':
switchD_00108a6f_caseD_68:
      return;
    case '\f':
      pcVar3 = "\\f";
      break;
    case '\r':
      pcVar3 = "\\r";
      break;
    default:
      if (cVar1 == '\"') goto switchD_00108a41_caseD_6;
      if (cVar1 != '\\') {
        return;
      }
      pcVar3 = "\\\\";
    }
    break;
  case 3:
    if ((source[t->start] != '\r') && (source[t->start] != '\n')) {
      return;
    }
switchD_00108b6e_caseD_a:
    pcVar3 = "\\n";
    break;
  case 4:
switchD_00108a41_caseD_4:
    fprintf(_stderr,"Error parsing token type %d\n");
    return;
  case 6:
switchD_00108a41_caseD_6:
    pcVar3 = "\\\"";
    break;
  default:
    switch(t->type) {
    case 100:
      ppsVar4 = &t->child;
      while (psVar2 = *ppsVar4, psVar2 != (simple_token *)0x0) {
        out_00 = d_string_new("");
        export_token_tree_to_json(out_00,psVar2->child,source,0,s,array_out);
        stack_push(s,out_00->str);
        d_string_free(out_00,false);
        ppsVar4 = &psVar2->next;
      }
      if (!array_out) {
        return;
      }
      indent(out,lev);
      pcVar3 = "[\n";
      break;
    case 0x65:
      indent(out,lev);
      pcVar3 = "{\n";
      if (array_out) {
        pcVar3 = "[\n";
      }
      break;
    case 0x66:
      d_string_append_c_array(out,"\"",1);
      export_token_tree_to_json(out,t->child,source,lev,s,array_out);
      d_string_append_c_array(out,"\"",1);
      goto LAB_00108c01;
    case 0x67:
      export_token_tree_to_json(out,t->child,source,lev,s,array_out);
LAB_00108c01:
      if ((t->next == (simple_token *)0x0) || ((t->next->type & 0xfffe) != 0x66)) goto LAB_00108d35;
      goto LAB_00108d2c;
    case 0x68:
      goto switchD_00108a6f_caseD_68;
    default:
      goto switchD_00108a41_caseD_4;
    }
    d_string_append_c_array(out,pcVar3,2);
    index = 0;
    ppsVar4 = &t->child;
    while (psVar2 = *ppsVar4, psVar2 != (simple_token *)0x0) {
      indent(out,lev + 1);
      if (!array_out) {
        d_string_append_c_array(out,"\"",1);
        pcVar3 = (char *)stack_peek_index(s,index);
        d_string_append(out,pcVar3);
        d_string_append_c_array(out,"\": ",3);
      }
      export_token_to_json(out,psVar2,source,lev,s,array_out);
      index = index + 1;
      ppsVar4 = &psVar2->next;
    }
    indent(out,lev);
    pcVar3 = "}";
    if (array_out) {
      pcVar3 = "]";
    }
    d_string_append_c_array(out,pcVar3,1);
    if ((t->next == (simple_token *)0x0) || (t->next->type != 0x65)) {
LAB_00108d35:
      pcVar3 = "\n";
      sStack_60 = 1;
      goto LAB_00108d78;
    }
LAB_00108d2c:
    pcVar3 = ",\n";
  }
  sStack_60 = 2;
LAB_00108d78:
  d_string_append_c_array(out,pcVar3,sStack_60);
  return;
}

Assistant:

void export_token_to_json(DString * out, simple_token * t, const char * source, int lev, stack * s, bool array_out) {
	DString * header;
	int count = 0;
	char * text;
	simple_token * c;

	if (t) {
		switch (t->type) {
			case 0:
				print_const("[\n");
				export_token_tree_to_json(out, t->child, source, lev + 1, s, array_out);
				print_const("]\n");
				break;

			case TDP_HEADER:
				c = t->child;

				while (c) {
					header = d_string_new("");
					export_token_tree_to_json(header, c->child, source, 0, s, array_out);
					stack_push(s, header->str);
					d_string_free(header, false);
					c = c->next;
				}

				if (!array_out) {
					break;
				}

			case TDP_RECORD:
				indent(out, lev);

				if (array_out) {
					print_const("[\n");
				} else {
					print_const("{\n");
				}

				c = t->child;

				while (c) {
					indent(out, lev + 1);

					if (!array_out) {
						print_const("\"");
						text = stack_peek_index(s, count);
						print(text);
						print_const("\": ");
					}

					export_token_to_json(out, c, source, lev, s, array_out);

					count++;
					c = c->next;
				}

				indent(out, lev);

				if (array_out) {
					print_const("]");
				} else {
					print_const("}");
				}

				if (t->next && t->next->type == TDP_RECORD) {
					print_const(",\n");
				} else {
					print_const("\n");
				}

				break;

			case TDP_FIELD_NUMERIC:
				export_token_tree_to_json(out, t->child, source, lev, s, array_out);

				if (t->next && (t->next->type == TDP_FIELD || t->next->type == TDP_FIELD_NUMERIC)) {
					print_const(",\n");
				} else {
					print_const("\n");
				}

				break;

			case TDP_FIELD:
				print_const("\"");
				export_token_tree_to_json(out, t->child, source, lev, s, array_out);
				print_const("\"");

				if (t->next && (t->next->type == TDP_FIELD || t->next->type == TDP_FIELD_NUMERIC)) {
					print_const(",\n");
				} else {
					print_const("\n");
				}

				break;

			case TEXT_PLAIN:
			case TEXT_NUMERIC:
			case FIELD_DELIMITER:
				print_token(t);
				break;

			case RECORD_DELIMITER:
				switch (source[t->start]) {
					case '\n':
					case '\r':
						print_const("\\n");
						break;
				}

				break;

			case NEEDS_ESCAPE:
				switch (source[t->start]) {
					case '\b':
						print_const("\\b");
						break;

					case '\f':
						print_const("\\f");
						break;

					case '\n':
						print_const("\\n");
						break;

					case '\r':
						print_const("\\r");
						break;

					case '\t':
						print_const("\\t");
						break;

					case '\"':
						print_const("\\\"");
						break;

					case '\\':
						print_const("\\\\");
						break;

				}

				break;

			case TDP_EMPTY_STRING:
				break;

			case ESCAPED_ESCAPE:
				// TODO: Customize
				print_const("\\\"");
				break;

			default:
				fprintf(stderr, "Error parsing token type %d\n", t->type);
				break;
		}
	}
}